

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O2

int __thiscall mbc::Val::PersonHandle::remove(PersonHandle *this,char *__filename)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
  *this_00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  _List_node_base *p_Var2;
  int iVar3;
  Str *pSVar4;
  undefined4 extraout_var;
  iterator __position;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __position_00;
  
  if (*(this->super_ValBase).is_vaild_ == true) {
    this_00 = &this->mb_->persons_->_M_t;
    pSVar4 = Person::ID(this->person_);
    iVar3 = (*(pSVar4->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar4);
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
                 ::find(this_00,(key_type *)CONCAT44(extraout_var,iVar3));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
                        *)this->mb_->persons_,__position);
    plVar1 = this->mb_->order_;
    p_Var2 = (plVar1->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    pSVar4 = Person::ID(this->person_);
    iVar3 = (*(pSVar4->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar4);
    __position_00 =
         std::
         __find_if<std::_List_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                   (p_Var2,plVar1,iVar3);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(this->mb_->order_,(const_iterator)__position_00._M_node);
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return (int)this;
}

Assistant:

PersonHandle& PersonHandle::remove() {
    if(*is_vaild_) {
        // remove self in mb_ -> persons_
        auto it_persons = mb_ -> persons_ -> find(person_ -> ID().raw());
        mb_ -> persons_ -> erase(it_persons);

        // remove self in mb_ -> order_
        auto it_order = std::find(mb_->order_->begin(), mb_->order_->end(), 
                                 person_ -> ID().raw() );
        mb_ -> order_ -> erase(it_order);

        // save messagebook and reset self, now it is unvaild
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}